

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

void free_rule(ip_rule_t *ipr)

{
  list_head *plVar1;
  list_head *__mptr_2;
  list_head *__mptr_1;
  list_head *__mptr;
  ip_match_t *q;
  ip_match_t *p;
  ip_rule_t *ipr_local;
  
  if (ipr != (ip_rule_t *)0x0) {
    list_del(&ipr->list);
    plVar1 = (ipr->matchs).next;
    q = (ip_match_t *)(plVar1 + -1);
    plVar1 = plVar1->next;
    while (__mptr = plVar1 + -1, &q->list != &ipr->matchs) {
      free_match(q);
      q = (ip_match_t *)__mptr;
      plVar1 = plVar1->next;
    }
    if (ipr->target_ext != (ip_target_t *)0x0) {
      if (ipr->target_ext->data != (void *)0x0) {
        mwFree(ipr->target_ext->data,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
               0x51);
        ipr->target_ext->data = (void *)0x0;
      }
      if (ipr->target_ext != (ip_target_t *)0x0) {
        mwFree(ipr->target_ext,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
               0x52);
        ipr->target_ext = (ip_target_t *)0x0;
      }
    }
    if (ipr != (ip_rule_t *)0x0) {
      mwFree(ipr,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
             0x55);
    }
  }
  return;
}

Assistant:

static void free_rule(ip_rule_t *ipr)
{
	if (ipr == NULL) {
		return;
	}

	list_del(&ipr->list);

	ip_match_t *p = NULL, *q = NULL;

	list_for_each_entry_safe(p, q, &ipr->matchs, list) {
		free_match(p);
	}

	if (ipr->target_ext) {
		_free(ipr->target_ext->data);
		_free(ipr->target_ext);
	}

	_free(ipr);
}